

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
CommandLineOptions::CommandLineOptions(CommandLineOptions *this,CommandLineOptions *param_1)

{
  CommandLineOptions *param_1_local;
  CommandLineOptions *this_local;
  
  this->blankEOF = (bool)(param_1->blankEOF & 1);
  std::__cxx11::string::string((string *)&this->comment,(string *)&param_1->comment);
  std::__cxx11::string::string((string *)&this->delimiter,(string *)&param_1->delimiter);
  std::__cxx11::string::string((string *)&this->fileInput,(string *)&param_1->fileInput);
  std::__cxx11::string::string((string *)&this->fileOutput,(string *)&param_1->fileOutput);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->filterColumns,&param_1->filterColumns);
  DataFilters::DataFilters(&this->filterRows,&param_1->filterRows);
  memcpy(&this->headerRow,&param_1->headerRow,0x3e);
  return;
}

Assistant:

CommandLineOptions()
    {
        this->blankEOF = false;
        this->comment = "";
        this->delimiter = "";
        this->fileInput = "";
        this->fileOutput = "";
        this->filterColumns = std::vector<bool>();
        this->headerRow = 0;
        this->numLinesToKeep = std::numeric_limits<int>::max();
        this->numLinesToReshape = 1;
        this->numLinesToSkip = 0;
        this->removeDuplicates = false;
        this->seed = 1;
        this->showCorrelation = false;
        this->showCovariance = false;
        this->showFilteredData = false;
        this->showHistogram = false;
        this->showLeastSquaresOffset = false;
        this->showLeastSquaresSlope = false;
        this->showStatistics = false;
        this->strictParsing = false;
        this->verboseLevel = 0;
    }